

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char * rtosc_skip_next_printed_arg
                 (char *src,int *skipped,char *type,char *llhssrc,int follow_ellipsis,
                 int inside_bundle)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  size_t sVar7;
  size_t sVar8;
  ushort **ppuVar9;
  char *pcVar10;
  char *in_RCX;
  int *in_RDX;
  char *pcVar11;
  int *in_RSI;
  char *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int32_t num;
  _Bool has_delta;
  char *next_ellipsis_from_llhssrc;
  size_t in_stack_00000058;
  _Bool llhsarg_is_useless;
  char *endsrc;
  _Bool infinite_range;
  char *in_stack_00000068;
  _Bool numeric_range;
  rtosc_arg_val_t delta;
  int rhsskipped;
  int llhsskipped;
  size_t zero;
  char rhstype [2];
  char llhstype;
  char lhstype;
  rtosc_arg_val_t rhsarg;
  rtosc_arg_val_t lhsarg;
  rtosc_arg_val_t llhsarg;
  char *lhssrc;
  char *ellipsis;
  char *rhssrc;
  char *src2;
  char *after_num;
  int rd_2;
  int expm;
  int rd_1;
  int skipped2_1;
  int blobsize;
  int rd;
  char *oldsrc;
  char *newsrc;
  int skipped2;
  char arraytype_cur;
  char *recent_src;
  char arraytype;
  int esc;
  size_t i;
  char *old_src;
  char deltaless_range_type;
  char dummy;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  char **in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  char **in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  char *local_170;
  char *local_160;
  char *local_138;
  int in_stack_fffffffffffffedc;
  rtosc_arg_val_t *in_stack_fffffffffffffee0;
  rtosc_arg_val_t *in_stack_fffffffffffffee8;
  rtosc_arg_val_t *in_stack_fffffffffffffef0;
  rtosc_arg_val_t *llhsarg_00;
  char local_fa;
  char *local_a0;
  char *local_98;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74 [3];
  char *local_68;
  int local_60;
  char local_59;
  char *local_58;
  char local_4d;
  int local_4c;
  ulong local_48;
  char *local_40;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *local_10;
  
  if (in_RDX == (int *)0x0) {
    in_RDX = (int *)&stack0xffffffffffffffcf;
  }
  *in_RSI = 1;
  iVar5 = CONCAT13((char)((uint)in_stack_ffffffffffffffcc >> 0x18),
                   (uint3)(ushort)in_stack_ffffffffffffffcc);
  local_40 = in_RDI;
  local_10 = in_RDI;
  switch(*in_RDI) {
  case '\"':
    local_10 = end_of_printed_string
                         ((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if ((local_10 == (char *)0x0) || (*local_10 != 'S')) {
      *(char *)in_RDX = 's';
    }
    else {
      local_10 = local_10 + 1;
      *(char *)in_RDX = 'S';
    }
    break;
  case '#':
    for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
      local_10 = local_10 + 1;
      ppuVar9 = __ctype_b_loc();
      if (((*ppuVar9)[(int)*local_10] & 0x1000) == 0) {
        local_10 = (char *)0x0;
        local_48 = 8;
      }
    }
    if (local_10 != (char *)0x0) {
      local_10 = local_10 + 1;
    }
    *(char *)in_RDX = 'r';
    break;
  default:
    iVar4 = is_range_multiplier((char *)in_stack_fffffffffffffe70);
    if (iVar4 == 0) {
      if ((*in_RDI == '_') || (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)*in_RDI] & 0x400) != 0))
      {
        while( true ) {
          bVar12 = true;
          if (*local_10 != '_') {
            ppuVar9 = __ctype_b_loc();
            bVar12 = ((*ppuVar9)[(int)*local_10] & 8) != 0;
          }
          if (!bVar12) break;
          local_10 = local_10 + 1;
        }
        *(char *)in_RDX = 'S';
      }
      else {
        iVar4 = skip_fmt(in_stack_fffffffffffffe70,
                         (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (iVar4 == 0) {
          sVar8 = skip_numeric((char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ),(char *)in_stack_fffffffffffffe70);
          if ((int)sVar8 == 0) {
            local_10 = (char *)0x0;
          }
          else {
            skip_while(in_stack_fffffffffffffe70,
                       (_func_int_int *)
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
            if (*in_RDI == '(') {
              if (((char)*in_RDX == 'f') || ((char)*in_RDX == 'd')) {
                local_10 = in_RDI + 1;
                skip_while(in_stack_fffffffffffffe70,
                           (_func_int_int *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
                sVar8 = skip_numeric((char **)CONCAT44(in_stack_fffffffffffffe7c,
                                                       in_stack_fffffffffffffe78),
                                     (char *)in_stack_fffffffffffffe70);
                if ((int)sVar8 == 0) {
                  local_10 = (char *)0x0;
                }
                else {
                  skip_fmt_null(in_stack_fffffffffffffe70,
                                (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ));
                }
              }
              else {
                local_10 = (char *)0x0;
              }
            }
          }
        }
        else {
          iVar4 = skip_fmt(in_stack_fffffffffffffe70,
                           (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          if ((((iVar4 != 0) &&
               (iVar4 = skip_fmt(in_stack_fffffffffffffe70,
                                 (char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68)), iVar4 != 0)) &&
              (iVar4 = skip_fmt(in_stack_fffffffffffffe70,
                                (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                )), iVar4 != 0)) &&
             (iVar4 = skip_fmt(in_stack_fffffffffffffe70,
                               (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                              ), iVar4 != 0)) {
            skip_fmt(in_stack_fffffffffffffe70,
                     (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
            iVar4 = skip_fmt(in_stack_fffffffffffffe70,
                             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
            if (iVar4 == 0) {
              local_10 = (char *)0x0;
            }
            else {
              local_80 = 0;
              __isoc99_sscanf(in_RDI,"-%d s )%n",&local_84,&local_80);
              if (((local_80 == 0) || (local_84 < 1)) || (0x20 < local_84)) {
                local_10 = (char *)0x0;
              }
              else {
                local_10 = in_RDI + local_80;
              }
            }
          }
          *(char *)in_RDX = 't';
        }
      }
    }
    else {
      do {
        pcVar10 = local_10 + 1;
        local_10 = local_10 + 1;
      } while (*pcVar10 != 'x');
      local_10 = rtosc_skip_next_printed_arg
                           ((char *)in_RSI,in_RDX,in_RCX,(char *)CONCAT44(in_R8D,in_R9D),iVar5,
                            in_stack_ffffffffffffffc8);
      if (local_10 != (char *)0x0) {
        *(char *)in_RDX = '-';
        *in_RSI = local_7c + *in_RSI;
      }
    }
    break;
  case '\'':
    local_4c = -1;
    sVar7 = strlen(in_RDI);
    if (sVar7 < 3) {
      return (char *)0x0;
    }
    if ((in_RDI[1] == '\\') &&
       ((in_RDI[2] != '\'' ||
        ((in_RDI[3] != '\0' &&
         (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)in_RDI[3]] & 0x2000) == 0)))))) {
      local_10 = in_RDI + 1;
      cVar3 = get_escaped_char(in_RDI[2],1);
      local_4c = (int)cVar3;
    }
    if ((local_4c == 0) || (local_10[2] != '\'')) {
      local_160 = (char *)0x0;
    }
    else {
      local_160 = local_10 + 3;
    }
    local_10 = local_160;
    *(char *)in_RDX = 'c';
    break;
  case 'B':
    skip_fmt_null(in_stack_fffffffffffffe70,
                  (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (in_RDI == (char *)0x0) {
      *(char *)in_RDX = 'S';
      local_10 = skip_identifier((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68));
    }
    else {
      *(char *)in_RDX = 'b';
      local_74[0] = 0;
      local_78 = 0;
      __isoc99_sscanf(in_RDI,"%i %n",&local_78,local_74);
      if (local_74[0] == 0) {
        local_170 = (char *)0x0;
      }
      else {
        local_170 = in_RDI + local_74[0];
      }
      local_10 = local_170;
      while( true ) {
        bVar12 = false;
        if (local_170 != (char *)0x0) {
          bVar12 = *local_170 == '0';
        }
        if (!bVar12) break;
        skip_fmt_null(in_stack_fffffffffffffe70,
                      (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        local_78 = local_78 + -1;
      }
      if (local_78 != 0) {
        local_10 = (char *)0x0;
      }
      if (local_10 != (char *)0x0) {
        if (*local_10 == ']') {
          local_10 = local_10 + 1;
        }
        else {
          local_10 = (char *)0x0;
        }
      }
    }
    break;
  case 'M':
    iVar4 = strncmp("MIDI",in_RDI,4);
    if ((iVar4 == 0) &&
       ((ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)in_RDI[4]] & 0x2000) != 0 || (in_RDI[4] == '[')
        ))) {
      skip_fmt_null(in_stack_fffffffffffffe70,
                    (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      *(char *)in_RDX = 'm';
    }
    else {
      local_10 = skip_identifier((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68));
      *(char *)in_RDX = 'S';
    }
    break;
  case '[':
    local_10 = in_RDI;
    do {
      ppuVar9 = __ctype_b_loc();
      pcVar11 = local_10 + 1;
      pcVar10 = local_10 + 1;
      local_10 = pcVar11;
    } while (((*ppuVar9)[(int)*pcVar10] & 0x2000) != 0);
    local_4d = '\0';
    local_58 = (char *)0x0;
    while( true ) {
      bVar12 = false;
      if ((local_10 != (char *)0x0) && (bVar12 = false, *local_10 != '\0')) {
        bVar12 = *local_10 != ']';
      }
      if (!bVar12) break;
      local_59 = '\x14';
      local_68 = rtosc_skip_next_printed_arg
                           ((char *)in_RSI,in_RDX,in_RCX,(char *)CONCAT44(in_R8D,in_R9D),iVar5,
                            in_stack_ffffffffffffffc8);
      local_58 = local_10;
      local_10 = local_68;
      if (local_68 != (char *)0x0) {
        while (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)*local_10] & 0x2000) != 0) {
          local_10 = local_10 + 1;
        }
      }
      if (local_4d == '\0') {
        local_4d = local_59;
      }
      else {
        iVar4 = arraytypes_match('\0','\0');
        if (iVar4 == 0) {
          local_10 = (char *)0x0;
        }
      }
      *in_RSI = local_60 + *in_RSI;
    }
    if (local_10 != (char *)0x0) {
      if (*local_10 == '\0') {
        local_10 = (char *)0x0;
      }
      else {
        local_10 = local_10 + 1;
      }
    }
    *(undefined1 *)in_RDX = 0x61;
    break;
  case 'f':
    pcVar10 = skip_word((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                        in_stack_fffffffffffffe80);
    if (pcVar10 == (char *)0x0) {
      local_10 = skip_identifier((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68));
      *(char *)in_RDX = 'S';
    }
    else {
      *(char *)in_RDX = 'F';
    }
    break;
  case 'i':
    pcVar10 = skip_word((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                        in_stack_fffffffffffffe80);
    if (pcVar10 == (char *)0x0) {
      pcVar10 = skip_word((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe80);
      if (pcVar10 == (char *)0x0) {
        local_10 = skip_identifier((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                    in_stack_fffffffffffffe68));
        *(char *)in_RDX = 'S';
      }
      else {
        *(char *)in_RDX = 't';
      }
    }
    else {
      *(char *)in_RDX = 'I';
    }
    break;
  case 'n':
    pcVar10 = skip_word((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                        in_stack_fffffffffffffe80);
    if (pcVar10 == (char *)0x0) {
      pcVar10 = skip_word((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                          in_stack_fffffffffffffe80);
      if (pcVar10 == (char *)0x0) {
        local_10 = skip_identifier((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                    in_stack_fffffffffffffe68));
        *(char *)in_RDX = 'S';
      }
      else {
        *(char *)in_RDX = 't';
      }
    }
    else {
      *(char *)in_RDX = 'N';
    }
    break;
  case 't':
    pcVar10 = skip_word((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                        in_stack_fffffffffffffe80);
    if (pcVar10 == (char *)0x0) {
      local_10 = skip_identifier((char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68));
      *(char *)in_RDX = 'S';
    }
    else {
      *(char *)in_RDX = 'T';
    }
  }
  if ((in_R8D != 0) && (local_10 != (char *)0x0)) {
    local_98 = local_10;
    while (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)*local_98] & 0x2000) != 0) {
      local_98 = local_98 + 1;
    }
    iVar4 = strncmp(local_98,"...",3);
    if (iVar4 == 0) {
      local_10 = (char *)0x0;
      iVar4 = is_range_multiplier((char *)in_stack_fffffffffffffe70);
      if (iVar4 != 0) {
        strchr(local_40,0x78);
      }
      cVar3 = (char)((uint)iVar5 >> 0x10);
      if (cVar3 == '\0') {
        cVar3 = (char)*in_RDX;
      }
      cVar1 = 'x';
      *(char *)in_RDX = '-';
      llhsarg_00 = (rtosc_arg_val_t *)0x0;
      local_a0 = local_98 + 2;
      do {
        ppuVar9 = __ctype_b_loc();
        local_138 = local_a0 + 1;
        pcVar10 = local_a0 + 1;
        local_a0 = local_138;
      } while (((*ppuVar9)[(int)*pcVar10] & 0x2000) != 0);
      pcVar10 = numeric_range_types();
      pcVar10 = strchr(pcVar10,(int)cVar3);
      bVar13 = pcVar10 != (char *)0x0;
      bVar12 = false;
      if (*local_138 == ']') {
        bVar12 = true;
        cVar1 = cVar3;
      }
      else {
        if (!bVar13) {
          return (char *)0x0;
        }
        local_138 = rtosc_skip_next_printed_arg
                              ((char *)in_RSI,in_RDX,in_RCX,(char *)CONCAT44(in_R8D,in_R9D),iVar5,
                               in_stack_ffffffffffffffc8);
        if (local_138 == (char *)0x0) {
          return (char *)0x0;
        }
        rtosc_scan_arg_val((char *)delta.val.b.data,(rtosc_arg_val_t *)delta.val.s,delta._0_8_,
                           in_stack_00000068,(size_t *)endsrc,in_stack_00000058,(int)zero);
      }
      if (cVar3 == cVar1) {
        if (bVar13) {
          rtosc_scan_arg_val((char *)delta.val.b.data,(rtosc_arg_val_t *)delta.val.s,delta._0_8_,
                             in_stack_00000068,(size_t *)endsrc,in_stack_00000058,(int)zero);
        }
        if (in_RCX == (char *)0x0) {
          bVar14 = true;
        }
        else {
          pcVar10 = strstr(in_RCX,"...");
          if (pcVar10 < local_98) {
            pcVar10 = pcVar10 + 2;
            do {
              ppuVar9 = __ctype_b_loc();
              in_RCX = pcVar10 + 1;
              pcVar11 = pcVar10 + 1;
              pcVar10 = in_RCX;
            } while (((*ppuVar9)[(int)*pcVar11] & 0x2000) != 0);
          }
          else {
            iVar4 = is_range_multiplier((char *)in_stack_fffffffffffffe70);
            if (iVar4 != 0) {
              in_RCX = strchr(in_RCX,0x78);
              in_RCX = in_RCX + 1;
            }
          }
          rtosc_skip_next_printed_arg
                    ((char *)in_RSI,in_RDX,in_RCX,(char *)CONCAT44(in_R8D,in_R9D),iVar5,
                     in_stack_ffffffffffffffc8);
          iVar5 = types_match(local_fa,cVar3);
          if (iVar5 == 0) {
            bVar14 = true;
          }
          else {
            rtosc_scan_arg_val((char *)delta.val.b.data,(rtosc_arg_val_t *)delta.val.s,delta._0_8_,
                               in_stack_00000068,(size_t *)endsrc,in_stack_00000058,(int)zero);
            iVar5 = rtosc_arg_vals_cmp_single
                              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                               (rtosc_cmp_options *)in_stack_fffffffffffffee0);
            bVar14 = iVar5 == 0;
          }
        }
        bVar2 = true;
        if ((!bVar12) || ((!bVar14 && (bVar13)))) {
          iVar6 = delta_from_arg_vals(llhsarg_00,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                                      ,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          if (iVar6 == -1) {
            if (!bVar12) {
              return (char *)0x0;
            }
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
        local_10 = local_138;
        if (bVar2) {
          *in_RSI = *in_RSI + 1;
        }
        *in_RSI = *in_RSI + 1;
      }
    }
  }
  return local_10;
}

Assistant:

const char* rtosc_skip_next_printed_arg(const char* src, int* skipped,
                                        char* type, const char* llhssrc,
                                        int follow_ellipsis, int inside_bundle)
{
    char dummy;
    if(!type)
        type = &dummy;
    assert(skipped);
    assert(src);
    *skipped = 1; // in almost all cases

    char deltaless_range_type = 0;

    const char* old_src = src;
    switch(*src)
    {
        case 't':
            if(skip_word("true", &src))
                *type = 'T';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'f':
            if(skip_word("false", &src))
                *type = 'F';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'n':
            if(skip_word("nil", &src))
                *type = 'N';
            else if(skip_word("now", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'i':
            if(skip_word("inf", &src))
                *type = 'I';
            else if(skip_word("immediately", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '#':
            for(size_t i = 0; i<8; ++i)
            {
                ++src;
                if(!isxdigit(*src)) {
                    src = NULL;
                    i = 8;
                }
            }
            if(src) ++src;
            *type = 'r';
            break;
        case '\'':
        {
            int esc = -1;
            if(strlen(src) < 3)
                return NULL;
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\' => mistyped backslash
            if(src[1] == '\\') {
                if(src[2] == '\'' && (!src[3] || isspace(src[3])))
                {
                    // type 4
                    // the user inputs '\', which is wrong, but
                    // we accept it as a backslash anyways
                }
                else
                {
                    ++src; // type 2 or 3
                    esc = get_escaped_char(src[1], 1);
                }
            }
            // if the last char was no single quote,
            // or we had an invalid escape sequence, return NULL
            src = (!esc || src[2] != '\'') ? NULL : (src + 3);
            *type = 'c';
            break;
        }
        case '"':
            src = end_of_printed_string(src);
            if(src && *src == 'S') {
                ++src;
                *type = 'S';
            }
            else
                *type = 's';
            break;
        case 'M':
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                skip_fmt_null(&src, "MIDI [ 0x%*x 0x%*x 0x%*x 0x%*x ]%n");
                *type = 'm';
            }
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '[':
        {
            while(isspace(*++src));
            char arraytype = 0;
            const char* recent_src = NULL;
            while(src && *src && *src != ']')
            {
                char arraytype_cur = 20;
                int skipped2;
                const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped2,
                                                                 &arraytype_cur,
                                                                 recent_src, 1,
                                                                 true);
                recent_src = src;
                src = newsrc;

                if(src)
                    for( ; isspace(*src); ++src) ;
                if(!arraytype)
                    arraytype = arraytype_cur;
                else if(!arraytypes_match(arraytype, arraytype_cur))
                    src = NULL;
                *skipped += skipped2;
            }
            if(src)
            {
                if(*src) // => ']'
                    ++src;
                else
                    src = NULL;
            }
            *type = 'a';
            break;
        }
        case 'B':
        {
            const char* oldsrc = src;
            skip_fmt_null(&src, "BLOB [ %n");
            if(src)
            {
                *type = 'b';
                int rd = 0, blobsize = 0;
                sscanf(src, "%i %n", &blobsize, &rd);
                src = rd ? (src + rd) : NULL;
                for(;src && *src == '0';) // i.e. 0x...
                {
                    skip_fmt_null(&src, "0x%*x %n");
                    blobsize--;
                }
                if(blobsize)
                    src = NULL;
                if(src)
                    src = (*src == ']') ? (src + 1) : NULL;
            }
            else
            {
                *type = 'S';
                src = skip_identifier(oldsrc);
            }
            break;
        }
        default:
        {
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                while(*++src != 'x') ;
                ++src;

                int skipped2;
                src = rtosc_skip_next_printed_arg(src, &skipped2,
                                                  &deltaless_range_type,
                                                  NULL, 0, inside_bundle);
                if(src) {
                    *type = '-';
                    *skipped += skipped2;
                }
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                for(; *src == '_' || isalnum(*src); ++src) ;
                *type = 'S';
            }
            // is it a date? (vs a numeric)
            else if(skip_fmt(&src, "%*4d-%*1d%*1d-%*1d%*1d%n"))
            {
                if(skip_fmt(&src, " %*2d:%*1d%*1d%n"))
                if(skip_fmt(&src, ":%*1d%*1d%n"))
                if(skip_fmt(&src, ".%*d%n"))
                {
                    if(skip_fmt(&src, " ( ... + 0x%n"))
                    {
                        skip_fmt(&src, "%*x.%n");
                        if(skip_fmt(&src, "%*xp%n"))
                        {
                            int rd = 0, expm;
                            sscanf(src, "-%d s )%n", &expm, &rd);
                            if(rd && expm > 0 && expm <= 32)
                            {
                                // ok
                                src += rd;
                            }
                            else
                                src = NULL;

                        }
                        else
                            src = NULL;
                    }
                }
                *type = 't';
            }
            else
            {
                int rd = skip_numeric(&src, type);
                if(!rd) { src = NULL; break; }
                const char* after_num = src;
                skip_while(&after_num, isspace);
                if(*after_num == '(')
                {
                    if (*type == 'f' || *type == 'd')
                    {
                        // skip lossless representation
                        src = ++after_num;
                        skip_while(&src, isspace);
                        rd = skip_numeric(&src, NULL);
                        if(!rd) { src = NULL; break; }
                        skip_fmt_null(&src, " )%n");
                    }
                    else
                        src = NULL;
                }
            }
        }
    }

    if(follow_ellipsis && src)
    {
        // is the argument being followed by an ellipsis?
        const char* src2 = src;
        for(; isspace(*src2); ++src2) ;

        if(!strncmp(src2, "...", 3))
        {
            src = src2;

            // What we need to do is only checking for correctness:
            //  * lhs (left hand sign) and rhs are given
            //  * lhs and rhs must be of the same type
            //  * there must be an "n" such that lhs + n*delta = rhs
            //    => therefore, compute delta
            //  * such "n" must not be 0

            const char* rhssrc = src;
            const char* ellipsis = src;
            src = NULL;
            const char* lhssrc;

            do
            {
                lhssrc = old_src;
                if(is_range_multiplier(lhssrc))
                    lhssrc = strchr(lhssrc, 'x') + 1;

                rtosc_arg_val_t llhsarg, lhsarg, rhsarg;
                char lhstype = deltaless_range_type ? deltaless_range_type
                                                    : *type,
                     llhstype, rhstype[2] = "x";

                *type = '-'; // TODO: bug? return scanned type instead,
                             //       to avoid [0.1 1 ...5]

                size_t zero = 0;
                int llhsskipped, rhsskipped;

                rtosc_arg_val_t delta;

                /*
                 * in all cases, check rhs
                 */
                rhssrc += 2;
                while(isspace(*++rhssrc)) ;

                bool numeric_range  = strchr(numeric_range_types(), lhstype),
                     infinite_range = false;
                const char* endsrc;
                if(*rhssrc == ']')
                {
                    assert(inside_bundle);
                    // we're still not finished. find out if delta-less or not
                    *rhstype = lhstype;
                    endsrc = rhssrc;
                    infinite_range = true;
                }
                else
                {
                    // non-infinite ranges are numeric, so check the type
                    if(!numeric_range)
                        break;

                    endsrc = rtosc_skip_next_printed_arg(rhssrc, &rhsskipped,
                                                         rhstype, NULL, 0,
                                                         inside_bundle);
                    if(!endsrc)
                        break;

                    rtosc_scan_arg_val(rhssrc, &rhsarg, 1, NULL, &zero, 0, 0);
                }

                /*
                 * do not check lhs; it has been checked above
                 */
                if(lhstype != *rhstype)
                {
                    // types must be equal
                    break;
                }

                if(numeric_range)
                    rtosc_scan_arg_val(lhssrc, &lhsarg, 1,
                                       NULL, &zero, 0, 0);

                /*
                 * is llhs given and useful?
                 */
                bool llhsarg_is_useless = false;
                if(llhssrc)
                {
                    const char* next_ellipsis_from_llhssrc =
                            strstr(llhssrc, "...");
                    if(next_ellipsis_from_llhssrc < ellipsis)
                    {
                        llhssrc = next_ellipsis_from_llhssrc + 2;
                        while(isspace(*++llhssrc)) ;
                    }
                    else if(is_range_multiplier(llhssrc))
                    {
                        llhssrc = strchr(llhssrc, 'x') + 1;
                    }

                    rtosc_skip_next_printed_arg(llhssrc,
                                                &llhsskipped, &llhstype,
                                                NULL, 0, inside_bundle);
                    if(types_match(llhstype, lhstype))
                    {
                        rtosc_scan_arg_val(llhssrc, &llhsarg, 1,
                                           NULL, &zero, 0, 0);
                        if(!rtosc_arg_vals_cmp_single(&llhsarg, &lhsarg, NULL))
                        {
                            llhsarg_is_useless = true;
                        }
                        // hint: use rtosc_arg_val_range_arg here if
                        // overlapping ranges (1 ... 5 ... 9) shall be
                        // implemented
                    }
                    else
                    {
                        llhsarg_is_useless = true;
                    }
                }
                else {
                    llhsarg_is_useless = true;
                }

                bool has_delta = true;
                /*
                    compute delta and check if it matches
                */
                if(infinite_range && (llhsarg_is_useless || !numeric_range))
                {
                    has_delta = false;
                }
                else
                {
                    int32_t num = delta_from_arg_vals(&llhsarg, &lhsarg,
                                                      infinite_range ? NULL
                                                                     : &rhsarg,
                                                      &delta,
                                                      llhsarg_is_useless);

                    if(num == -1)
                    {
                        if(infinite_range)
                        {
                            has_delta = false;
                        }
                        else
                        {
                            break;
                        }
                    }
                }

                // if we made it until here, set src to non-NULL
                src = endsrc;

                // ellipsis skips 3 arg vals: range, delta, start
                if(has_delta)
                    ++*skipped;
                ++*skipped;
            } while(false);
        }
    }

    return src;
}